

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Collimator.cpp
# Opt level: O1

void __thiscall imrt::Collimator::printIntensityLevels(Collimator *this)

{
  pointer piVar1;
  ostream *poVar2;
  ulong uVar3;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Intensity levels: ",0x12);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
  std::ostream::put('p');
  std::ostream::flush();
  piVar1 = (this->levels_to_intensity).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->levels_to_intensity).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != piVar1) {
    uVar3 = 0;
    do {
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,piVar1[uVar3]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
      uVar3 = uVar3 + 1;
      piVar1 = (this->levels_to_intensity).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
    } while (uVar3 < (ulong)((long)(this->levels_to_intensity).
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_finish - (long)piVar1 >> 2));
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
  std::ostream::put('p');
  std::ostream::flush();
  return;
}

Assistant:

void Collimator::printIntensityLevels (){
    cout << "Intensity levels: "<< endl;
    for (int i=0; i<levels_to_intensity.size(); i++){
      cout << levels_to_intensity[i] <<  " ";
    }
    cout << endl;
  }